

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

int __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  int iVar1;
  int iVar2;
  uint32 local_24;
  int message_size;
  int our_size;
  int number_local;
  Extension *this_local;
  
  if ((this->type == '\v') && ((this->is_repeated & 1U) == 0)) {
    if ((this->field_0xa & 1) == 0) {
      iVar1 = io::CodedOutputStream::VarintSize32(number);
      if (((byte)this->field_0xa >> 4 & 1) == 0) {
        local_24 = (**(code **)(((this->field_0).repeated_int32_value)->elements_ + 0x12))();
      }
      else {
        local_24 = (**(code **)(((this->field_0).repeated_int32_value)->elements_ + 0x10))();
      }
      iVar2 = io::CodedOutputStream::VarintSize32(local_24);
      this_local._4_4_ = local_24 + iVar2 + iVar1 + 4;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = ByteSize(this,number);
  }
  return this_local._4_4_;
}

Assistant:

int ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  int our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  int message_size = 0;
  if (is_lazy) {
    message_size = lazymessage_value->ByteSize();
  } else {
    message_size = message_value->ByteSize();
  }

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}